

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_io_object.hpp
# Opt level: O0

void __thiscall
asio::basic_io_object<asio::ip::resolver_service<asio::ip::tcp>,_false>::~basic_io_object
          (basic_io_object<asio::ip::resolver_service<asio::ip::tcp>,_false> *this)

{
  resolver_service<asio::ip::tcp> *in_RDI;
  implementation_type *in_stack_ffffffffffffffe8;
  
  ip::resolver_service<asio::ip::tcp>::destroy(in_RDI,in_stack_ffffffffffffffe8);
  std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)0x11e86f);
  return;
}

Assistant:

~basic_io_object()
  {
    service_.destroy(implementation_);
  }